

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cc
# Opt level: O2

double __thiscall ipx::Basis::MinSingularValue(Basis *this)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double local_68;
  Vector v;
  _Expr<std::__detail::_BinClos<std::__divides,_std::_ValArray,_std::_Constant,_double,_double>,_double>
  local_50;
  Vector fv;
  
  std::valarray<double>::valarray(&v,(long)this->model_->num_rows_);
  std::valarray<double>::valarray(&fv,(long)(int)v._M_size);
  uVar1 = 0;
  uVar3 = v._M_size & 0xffffffff;
  if ((int)v._M_size < 1) {
    uVar3 = uVar1;
  }
  while (uVar3 != uVar1) {
    v._M_data[uVar1] = 1.0 / (double)(int)(uVar1 + 1) + 1.0;
    uVar1 = uVar1 + 1;
  }
  local_50._M_closure.super__BinBase2<std::__divides,_std::valarray<double>_>._M_expr1 =
       (__type)Twonorm(&v);
  std::valarray<double>::operator/=(&v,(double *)&local_50);
  local_68 = 0.0;
  iVar2 = 0x65;
  do {
    iVar2 = iVar2 + -1;
    dVar4 = local_68;
    if (iVar2 == 0) break;
    SolveDense(this,&v,&fv,'N');
    SolveDense(this,&fv,&fv,'T');
    dVar4 = Twonorm(&fv);
    local_50._M_closure.super__BinBase2<std::__divides,_std::valarray<double>_>._M_expr1 = &fv;
    local_50._M_closure.super__BinBase2<std::__divides,_std::valarray<double>_>._M_expr2 = dVar4;
    std::valarray<double>::operator=(&v,&local_50);
    dVar5 = dVar4 - local_68;
    local_68 = dVar4;
  } while (dVar4 * 0.001 < ABS(dVar5));
  operator_delete(fv._M_data);
  dVar4 = 1.0 / dVar4;
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  operator_delete(v._M_data);
  return dVar4;
}

Assistant:

double Basis::MinSingularValue() const {
    const Int m = model_.rows();
    Vector v(m);

    // Computes maximum eigenvalue of inverse(B*B').
    double lambda = PowerMethod(
        [this](const Vector& x, Vector& fx) {
            SolveDense(x, fx, 'N');
            SolveDense(fx, fx, 'T'); }, v);
    return std::sqrt(1.0/lambda);
}